

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

pair<const_slang::ast::Statement_*,_bool> __thiscall
slang::ast::CaseStatement::getKnownBranch(CaseStatement *this,EvalContext *context)

{
  SourceRange range;
  string_view arg;
  SourceRange range_00;
  SourceRange range_01;
  undefined1 uVar1;
  bool bVar2;
  reference ppEVar3;
  Diagnostic *pDVar4;
  Diagnostic *arg_00;
  undefined8 extraout_RDX;
  long in_RDI;
  pair<const_slang::ast::Statement_*,_bool> pVar5;
  Diagnostic *diag_1;
  Diagnostic *diag;
  ConstantValue val_1;
  ConstantValue val;
  bool matched;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ItemGroup *group;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  bool unique;
  SourceRange matchRange;
  Statement *matchedStmt;
  ConstantValue cv;
  Type *condType;
  ConstantValue *in_stack_000002c8;
  EvalContext *in_stack_000002d0;
  ValueRangeExpression *in_stack_000002d8;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>
  *in_stack_fffffffffffffdc8;
  EvalContext *in_stack_fffffffffffffdd0;
  Expression *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  SourceLocation in_stack_fffffffffffffdf8;
  DiagCode in_stack_fffffffffffffe04;
  undefined4 uVar6;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  EvalContext *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 uVar7;
  SourceLocation in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 in_stack_fffffffffffffe48 [16];
  SourceLocation in_stack_fffffffffffffe80;
  Type *in_stack_fffffffffffffe88;
  bool local_141;
  void *local_140 [6];
  uint8_t local_10a;
  bool local_109;
  void *local_108 [6];
  bool local_d1;
  Expression *local_d0;
  Expression **local_c8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_c0;
  reference local_b8;
  reference local_b0;
  ItemGroup *local_a8;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_a0;
  long local_98;
  byte local_89;
  SourceLocation local_88;
  SourceLocation SStack_80;
  Expression *local_78;
  uint local_70;
  bool local_69;
  void *local_68 [8];
  long local_28;
  pair<const_slang::ast::Statement_*,_bool> local_10;
  
  local_28 = 0;
  Expression::eval(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  uVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa40958);
  if (!(bool)uVar1) {
    if (**(int **)(in_RDI + 0x20) != 0x18) {
      local_68[0] = (void *)0x0;
      local_69 = false;
      std::pair<const_slang::ast::Statement_*,_bool>::pair<std::nullptr_t,_bool,_true>
                (&local_10,local_68,&local_69);
      local_70 = 1;
      goto LAB_00a41089;
    }
    in_stack_fffffffffffffe28 =
         (SourceLocation)
         Expression::as<slang::ast::TypeReferenceExpression>(*(Expression **)(in_RDI + 0x20));
    local_28 = *(long *)((long)in_stack_fffffffffffffe28 + 0x30);
  }
  local_78 = (Expression *)0x0;
  SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffdd0);
  uVar7 = true;
  if (*(int *)(in_RDI + 0x44) != 1) {
    uVar7 = *(int *)(in_RDI + 0x44) == 2;
  }
  local_98 = in_RDI + 0x28;
  local_89 = uVar7;
  local_a0._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffdc8);
  local_a8 = (ItemGroup *)
             std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                       ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                        in_stack_fffffffffffffdd8);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffdc8), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_b8 = __gnu_cxx::
               __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
               ::operator*(&local_a0);
    local_b0 = local_b8;
    local_c0._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffdc8);
    local_c8 = (Expression **)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffdd8);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffdd0,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffdc8), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(&local_c0);
      local_d0 = *ppEVar3;
      if (local_d0->kind == ValueRange) {
        in_stack_fffffffffffffe18 =
             (EvalContext *)Expression::as<slang::ast::ValueRangeExpression>(local_d0);
        ValueRangeExpression::checkInside(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8);
        bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa40b82);
        in_stack_fffffffffffffe17 = bVar2;
        if (bVar2) {
          slang::ConstantValue::integer((ConstantValue *)0xa40c08);
          local_10a = (uint8_t)SVInt::operator_cast_to_logic_t((SVInt *)in_stack_fffffffffffffdc8);
          uVar6 = CONCAT13(local_10a,in_stack_fffffffffffffe04._0_3_);
          local_d1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffffdd0);
          in_stack_fffffffffffffe04.code._1_1_ = (undefined1)((uint)uVar6 >> 0x18);
          in_stack_fffffffffffffe04.subsystem = (DiagSubsystem)uVar6;
          in_stack_fffffffffffffe04.code._0_1_ = local_d1;
        }
        else {
          local_108[0] = (void *)0x0;
          local_109 = false;
          std::pair<const_slang::ast::Statement_*,_bool>::pair<std::nullptr_t,_bool,_true>
                    (&local_10,local_108,&local_109);
        }
        local_70 = (uint)!bVar2;
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa40c62);
      }
      else {
        Expression::eval(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa40ca4);
        in_stack_fffffffffffffe04.subsystem._1_1_ = bVar2;
        if (bVar2) {
          local_d1 = checkMatch(in_stack_fffffffffffffe48._8_4_,in_stack_fffffffffffffe48._0_8_,
                                (ConstantValue *)
                                CONCAT17(in_stack_fffffffffffffe47,
                                         CONCAT16(uVar1,in_stack_fffffffffffffe40)));
          in_stack_fffffffffffffe04.subsystem._0_1_ = local_d1;
LAB_00a40da8:
          local_70 = 0;
        }
        else {
          if ((local_28 != 0) && (local_d0->kind == TypeReference)) {
            in_stack_fffffffffffffdf8 =
                 (SourceLocation)Expression::as<slang::ast::TypeReferenceExpression>(local_d0);
            in_stack_fffffffffffffdf7 =
                 Type::isMatching(in_stack_fffffffffffffe88,(Type *)in_stack_fffffffffffffe80);
            local_d1 = (bool)in_stack_fffffffffffffdf7;
            goto LAB_00a40da8;
          }
          local_140[0] = (void *)0x0;
          local_141 = false;
          std::pair<const_slang::ast::Statement_*,_bool>::pair<std::nullptr_t,_bool,_true>
                    (&local_10,local_140,&local_141);
          local_70 = 1;
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa40dc0);
      }
      if (local_70 != 0) goto LAB_00a41089;
      if ((local_d1 & 1U) != 0) {
        if (local_78 == (Expression *)0x0) {
          in_stack_fffffffffffffdd8 =
               (Expression *)
               not_null::operator_cast_to_Statement_
                         ((not_null<const_slang::ast::Statement_*> *)0xa40ebc);
          local_88 = (local_d0->sourceRange).startLoc;
          SStack_80 = (local_d0->sourceRange).endLoc;
          local_78 = in_stack_fffffffffffffdd8;
        }
        else {
          range_00.startLoc._7_1_ = uVar7;
          range_00.startLoc._0_7_ = in_stack_fffffffffffffe20;
          range_00.endLoc = in_stack_fffffffffffffe28;
          pDVar4 = EvalContext::addDiag
                             (in_stack_fffffffffffffe18,SUB84((ulong)in_RDI >> 0x20,0),range_00);
          Diagnostic::operator<<
                    ((Diagnostic *)in_stack_fffffffffffffdd0,
                     (ConstantValue *)in_stack_fffffffffffffdc8);
          range.startLoc._7_1_ = in_stack_fffffffffffffdf7;
          range.startLoc._0_7_ = in_stack_fffffffffffffdf0;
          range.endLoc = in_stack_fffffffffffffdf8;
          in_stack_fffffffffffffe80 = SStack_80;
          Diagnostic::addNote(pDVar4,in_stack_fffffffffffffe04,range);
          local_89 = 0;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_c0);
    }
    if ((local_78 != (Expression *)0x0) && ((local_89 & 1) == 0)) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_a0);
  }
  if (local_78 == (Expression *)0x0) {
    local_78 = *(Expression **)(in_RDI + 0x38);
  }
  if ((local_78 == (Expression *)0x0) &&
     ((*(int *)(in_RDI + 0x44) == 3 || (*(int *)(in_RDI + 0x44) == 1)))) {
    range_01.startLoc._7_1_ = uVar7;
    range_01.startLoc._0_7_ = in_stack_fffffffffffffe20;
    range_01.endLoc = in_stack_fffffffffffffe28;
    arg_00 = EvalContext::addDiag(in_stack_fffffffffffffe18,SUB84((ulong)in_RDI >> 0x20,0),range_01)
    ;
    pDVar4 = arg_00;
    if (*(int *)(in_RDI + 0x44) == 3) {
      sv((char *)arg_00,(size_t)arg_00);
    }
    else {
      sv((char *)arg_00,(size_t)arg_00);
    }
    arg._M_str._0_7_ = in_stack_fffffffffffffe20;
    arg._M_len = (size_t)in_stack_fffffffffffffe18;
    arg._M_str._7_1_ = uVar7;
    Diagnostic::operator<<
              ((Diagnostic *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),arg);
    Diagnostic::operator<<(pDVar4,(ConstantValue *)arg_00);
  }
  std::pair<const_slang::ast::Statement_*,_bool>::pair<const_slang::ast::Statement_*&,_bool,_true>
            (&local_10,(Statement **)&local_78,(bool *)&stack0xfffffffffffffe47);
  local_70 = 1;
LAB_00a41089:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa41096);
  pVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar5.second = local_10.second;
  pVar5.first = local_10.first;
  return pVar5;
}

Assistant:

std::pair<const Statement*, bool> CaseStatement::getKnownBranch(EvalContext& context) const {
    const Type* condType = nullptr;
    auto cv = expr.eval(context);
    if (!cv) {
        if (expr.kind == ExpressionKind::TypeReference)
            condType = &expr.as<TypeReferenceExpression>().targetType;
        else
            return {nullptr, false};
    }

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;
    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;

    for (auto& group : items) {
        for (auto item : group.expressions) {
            bool matched;
            if (item->kind == ExpressionKind::ValueRange) {
                ConstantValue val = item->as<ValueRangeExpression>().checkInside(context, cv);
                if (!val)
                    return {nullptr, false};

                matched = (bool)(logic_t)val.integer();
            }
            else {
                auto val = item->eval(context);
                if (val)
                    matched = checkMatch(condition, cv, val);
                else if (condType && item->kind == ExpressionKind::TypeReference)
                    matched = item->as<TypeReferenceExpression>().targetType.isMatching(*condType);
                else
                    return {nullptr, false};
            }

            if (matched) {
                // If we already matched with a previous item, the only we reason
                // we'd still get here is to check for uniqueness. The presence of
                // another match means we failed the uniqueness check.
                if (matchedStmt) {
                    auto& diag =
                        context.addDiag(diag::ConstEvalCaseItemsNotUnique, item->sourceRange) << cv;
                    diag.addNote(diag::NotePreviousMatch, matchRange);
                    unique = false;
                }
                else {
                    // Always break out of the item group once we find a match -- even when
                    // checking uniqueness, expressions in a single group are not required
                    // to be unique.
                    matchedStmt = group.stmt;
                    matchRange = item->sourceRange;
                }
                break;
            }
        }

        if (matchedStmt && !unique)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (!matchedStmt &&
        (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique)) {

        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return {matchedStmt, true};
}